

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCSI.cpp
# Opt level: O3

void __thiscall SCSI::Bus::set_activity_observer(Bus *this,Observer *observer)

{
  long *local_38 [2];
  long local_28 [2];
  
  this->activity_observer_ = observer;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"SCSI","");
  (*observer->_vptr_Observer[2])(observer,local_38,0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void Bus::set_activity_observer(Activity::Observer *observer) {
	activity_observer_ = observer;
	activity_observer_->register_led("SCSI");
}